

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetField
               (uint32 field_number,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  undefined4 extraout_var;
  MessageLite *value;
  LogMessage *other;
  UnknownFieldSet *unknown_fields;
  LogFinisher local_61;
  LogMessage local_60;
  long *plVar4;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  if (field == (FieldDescriptor *)0x0) {
    unknown_fields = (UnknownFieldSet *)(**(code **)(*plVar4 + 0x18))(plVar4,message);
    bVar1 = SkipMessageSetField(input,field_number,unknown_fields);
    return bVar1;
  }
  if (*(int *)(field + 0x4c) != 3) {
    TVar3 = FieldDescriptor::type(field);
    if (TVar3 == TYPE_MESSAGE) {
      value = (MessageLite *)
              (**(code **)(*plVar4 + 0x138))(plVar4,message,field,input->extension_factory_);
      bVar1 = WireFormatLite::ReadMessage(input,value);
      return bVar1;
    }
  }
  LogMessage::LogMessage
            (&local_60,LOGLEVEL_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
             ,0x1d3);
  other = LogMessage::operator<<(&local_60,"Extensions of MessageSets must be optional messages.");
  LogFinisher::operator=(&local_61,other);
  LogMessage::~LogMessage(&local_60);
  return false;
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetField(uint32 field_number,
                                              const FieldDescriptor* field,
                                              Message* message,
                                              io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();
  if (field == NULL) {
    // We store unknown MessageSet extensions as groups.
    return SkipMessageSetField(
        input, field_number, message_reflection->MutableUnknownFields(message));
  } else if (field->is_repeated() ||
             field->type() != FieldDescriptor::TYPE_MESSAGE) {
    // This shouldn't happen as we only allow optional message extensions to
    // MessageSet.
    GOOGLE_LOG(ERROR) << "Extensions of MessageSets must be optional messages.";
    return false;
  } else {
    Message* sub_message = message_reflection->MutableMessage(
        message, field, input->GetExtensionFactory());
    return WireFormatLite::ReadMessage(input, sub_message);
  }
}